

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

void lj_meta_istype(lua_State *L,BCReg ra,BCReg tp)

{
  int narg;
  uint uVar1;
  BCReg tp_local;
  BCReg ra_local;
  lua_State *L_local;
  
  L->top = L->base + (int)(uint)*(byte *)(*(long *)((L->base[-2].u64 & 0x7fffffffffff) + 0x20) +
                                         -0x5d);
  narg = ra + 1;
  uVar1 = tp - 1;
  if (uVar1 == 0xe) {
    lj_lib_checknum(L,narg);
  }
  else {
    if (uVar1 != 4) {
      lj_err_argtype(L,narg,lj_obj_itypename[uVar1]);
    }
    lj_lib_checkstr(L,narg);
  }
  return;
}

Assistant:

void lj_meta_istype(lua_State *L, BCReg ra, BCReg tp)
{
  L->top = curr_topL(L);
  ra++; tp--;
  lj_assertL(LJ_DUALNUM || tp != ~LJ_TNUMX, "bad type for ISTYPE");
  if (LJ_DUALNUM && tp == ~LJ_TNUMX) lj_lib_checkint(L, ra);
  else if (tp == ~LJ_TNUMX+1) lj_lib_checknum(L, ra);
  else if (tp == ~LJ_TSTR) lj_lib_checkstr(L, ra);
  else lj_err_argtype(L, ra, lj_obj_itypename[tp]);
}